

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O3

vector<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
* __thiscall
lf::mesh::utils::internal::UnaryOpAdjoint::operator()
          (vector<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
           *__return_storage_ptr__,UnaryOpAdjoint *this,
          vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
          *u,int param_2)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  long lVar6;
  pointer pMVar7;
  ulong uVar8;
  __m128d mask;
  allocator_type local_29;
  vector<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  local_28;
  
  std::
  vector<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  ::vector(&local_28,
           (long)(u->
                 super__Vector_base<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(u->
                 super__Vector_base<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5,&local_29);
  pMVar7 = (u->
           super__Vector_base<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((u->
      super__Vector_base<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pMVar7) {
    lVar6 = 0x10;
    uVar8 = 0;
    do {
      puVar1 = (undefined4 *)
               ((long)((pMVar7->
                       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>).
                       m_storage.m_data.array + -1) + lVar6);
      uVar3 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      puVar2 = (undefined4 *)
               ((long)(((local_28.
                         super__Vector_base<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>).
                       m_storage.m_data.array + -1) + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      puVar2[2] = uVar4;
      puVar2[3] = uVar5 ^ 0x80000000;
      puVar1 = (undefined4 *)
               ((pMVar7->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>)
                .m_storage.m_data.array[0]._M_value + lVar6);
      uVar3 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      puVar2 = (undefined4 *)
               (((local_28.
                  super__Vector_base<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>).
                m_storage.m_data.array[0]._M_value + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      puVar2[2] = uVar4;
      puVar2[3] = uVar5 ^ 0x80000000;
      uVar8 = uVar8 + 1;
      pMVar7 = (u->
               super__Vector_base<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x20;
    } while (uVar8 < (ulong)((long)(u->
                                   super__Vector_base<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar7 >> 5))
    ;
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_28.
       super__Vector_base<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_28.
       super__Vector_base<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_28.
       super__Vector_base<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const std::vector<Eigen::Matrix<S, R, C, O, MR, MC>>& u,
                  int /*unused*/) const {
    std::vector<Eigen::Matrix<S, C, R>> result(u.size());
    for (std::size_t i = 0; i < u.size(); ++i) {
      result[i] = u[i].adjoint();
    }
    return result;
  }